

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void wallet::UpdateWalletSetting
               (Chain *chain,string *wallet_name,optional<bool> load_on_startup,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  bool bVar1;
  long *plVar2;
  long in_FS_OFFSET;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  undefined1 local_68 [32];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) == 0) goto LAB_0051f0a0;
  if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> & 1) == 0) {
    bVar1 = RemoveWalletSetting(chain,wallet_name);
    if (bVar1) goto LAB_0051f0a0;
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."
               ,"");
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,local_a8,local_a0 + (long)local_a8)
    ;
    local_48._M_p = (pointer)&local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_a8,local_a0 + (long)local_a8);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,(bilingual_str *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    plVar2 = local_a8;
    if (local_a8 == local_98) goto LAB_0051f0a0;
  }
  else {
    bVar1 = AddWalletSetting(chain,wallet_name);
    if (bVar1) goto LAB_0051f0a0;
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."
               ,"");
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,local_88,local_80 + (long)local_88)
    ;
    local_48._M_p = (pointer)&local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_88,local_80 + (long)local_88);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,(bilingual_str *)local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    local_98[0] = local_78[0];
    plVar2 = local_88;
    if (local_88 == local_78) goto LAB_0051f0a0;
  }
  operator_delete(plVar2,local_98[0] + 1);
LAB_0051f0a0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void UpdateWalletSetting(interfaces::Chain& chain,
                                const std::string& wallet_name,
                                std::optional<bool> load_on_startup,
                                std::vector<bilingual_str>& warnings)
{
    if (!load_on_startup) return;
    if (load_on_startup.value() && !AddWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."));
    } else if (!load_on_startup.value() && !RemoveWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."));
    }
}